

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int parsedate(char *date,time_t *output)

{
  int iVar1;
  time_t *ptVar2;
  _Bool _Var3;
  int iVar4;
  int *piVar5;
  long slnum;
  time_t tVar6;
  bool bVar7;
  int local_a0;
  int old_errno;
  int error;
  long lval;
  char *end;
  time_t *ptStack_70;
  int val;
  char *p;
  size_t len;
  _Bool found;
  time_t *ptStack_58;
  int part;
  char *indate;
  int local_48;
  assume dignext;
  int tzoff;
  int yearnum;
  int secnum;
  int minnum;
  int hournum;
  int mdaynum;
  int monnum;
  int wdaynum;
  time_t t;
  time_t *output_local;
  char *date_local;
  
  _monnum = 0;
  mdaynum = -1;
  hournum = -1;
  minnum = -1;
  secnum = -1;
  yearnum = -1;
  tzoff = -1;
  dignext = ~DATE_MDAY;
  local_48 = -1;
  indate._4_4_ = 0;
  len._4_4_ = 0;
  ptStack_58 = (time_t *)date;
  t = (time_t)output;
  output_local = (time_t *)date;
  do {
    if ((char)*output_local == '\0' || 5 < len._4_4_) {
      if (tzoff == -1) {
        secnum = 0;
        yearnum = 0;
        tzoff = 0;
      }
      if (((minnum == -1) || (hournum == -1)) || (dignext == ~DATE_MDAY)) {
        date_local._4_4_ = -1;
      }
      else if ((int)dignext < 0x62f) {
        date_local._4_4_ = -1;
      }
      else if (((minnum < 0x20) && (hournum < 0xc)) &&
              ((secnum < 0x18 && ((yearnum < 0x3c && (tzoff < 0x3d)))))) {
        tVar6 = time2epoch(tzoff,yearnum,secnum,minnum,hournum,dignext);
        if (local_48 == -1) {
          local_48 = 0;
        }
        if ((local_48 < 1) || (tVar6 <= 0x7fffffffffffffff - (long)local_48)) {
          *(long *)t = local_48 + tVar6;
          date_local._4_4_ = 0;
        }
        else {
          *(undefined8 *)t = 0x7fffffffffffffff;
          date_local._4_4_ = 1;
        }
      }
      else {
        date_local._4_4_ = -1;
      }
      return date_local._4_4_;
    }
    len._3_1_ = 0;
    skip((char **)&output_local);
    if ((((char)*output_local < 'a') || ('z' < (char)*output_local)) &&
       (((char)*output_local < 'A' || ('Z' < (char)*output_local)))) {
      ptVar2 = output_local;
      if ((('/' < (char)*output_local) && ((char)*output_local < ':')) &&
         ((tzoff != -1 ||
          (_Var3 = match_time((char *)output_local,&secnum,&yearnum,&tzoff,(char **)&lval),
          ptVar2 = (time_t *)lval, !_Var3)))) {
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        piVar5 = __errno_location();
        *piVar5 = 0;
        slnum = strtol((char *)output_local,(char **)&lval,10);
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        piVar5 = __errno_location();
        if (*piVar5 != iVar4) {
          piVar5 = __errno_location();
          *piVar5 = iVar4;
        }
        if (iVar1 != 0) {
          return -1;
        }
        if ((0x7fffffff < slnum) || (slnum < -0x80000000)) {
          return -1;
        }
        end._4_4_ = curlx_sltosi(slnum);
        if (((((local_48 == -1) && (lval - (long)output_local == 4)) && ((int)end._4_4_ < 0x579)) &&
            (ptStack_58 < output_local)) &&
           ((*(char *)((long)output_local + -1) == '+' ||
            (*(char *)((long)output_local + -1) == '-')))) {
          len._3_1_ = 1;
          iVar4 = ((int)end._4_4_ / 100) * 0x3c + (int)end._4_4_ % 100;
          local_a0 = iVar4 * 0x3c;
          if (*(char *)((long)output_local + -1) == '+') {
            local_a0 = iVar4 * -0x3c;
          }
          local_48 = local_a0;
        }
        if (((lval - (long)output_local == 8) && (dignext == ~DATE_MDAY)) &&
           ((hournum == -1 && (minnum == -1)))) {
          len._3_1_ = 1;
          dignext = (int)end._4_4_ / 10000;
          hournum = (int)((long)((ulong)(uint)((int)((long)(int)end._4_4_ % 10000) >> 0x1f) << 0x20
                                | (long)(int)end._4_4_ % 10000 & 0xffffffffU) / 100) + -1;
          minnum = (int)end._4_4_ % 100;
        }
        if ((((len._3_1_ & 1) == 0) && (indate._4_4_ == 0)) && (minnum == -1)) {
          if ((0 < (int)end._4_4_) && ((int)end._4_4_ < 0x20)) {
            len._3_1_ = 1;
            minnum = end._4_4_;
          }
          indate._4_4_ = 1;
        }
        if ((((len._3_1_ & 1) == 0) && (indate._4_4_ == 1)) && (dignext == ~DATE_MDAY)) {
          len._3_1_ = 1;
          dignext = end._4_4_;
          if ((int)end._4_4_ < 100) {
            if ((int)end._4_4_ < 0x47) {
              dignext = end._4_4_ + 2000;
            }
            else {
              dignext = end._4_4_ + 0x76c;
            }
          }
          if (minnum == -1) {
            indate._4_4_ = 0;
          }
        }
        ptVar2 = (time_t *)lval;
        if ((len._3_1_ & 1) == 0) {
          return -1;
        }
      }
    }
    else {
      p = (char *)0x0;
      ptStack_70 = output_local;
      while( true ) {
        if ((('`' < (char)*ptStack_70) && ((char)*ptStack_70 < '{')) ||
           ((bVar7 = false, '@' < (char)*ptStack_70 && (bVar7 = false, (char)*ptStack_70 < '[')))) {
          bVar7 = p < (char *)0xc;
        }
        if (!bVar7) break;
        ptStack_70 = (time_t *)((long)ptStack_70 + 1);
        p = p + 1;
      }
      if (p != (char *)0xc) {
        if ((mdaynum == -1) && (mdaynum = checkday((char *)output_local,(size_t)p), mdaynum != -1))
        {
          len._3_1_ = 1;
        }
        if ((((len._3_1_ & 1) == 0) && (hournum == -1)) &&
           (hournum = checkmonth((char *)output_local,(size_t)p), hournum != -1)) {
          len._3_1_ = 1;
        }
        if ((((len._3_1_ & 1) == 0) && (local_48 == -1)) &&
           (local_48 = checktz((char *)output_local,(size_t)p), local_48 != -1)) {
          len._3_1_ = 1;
        }
      }
      if ((len._3_1_ & 1) == 0) {
        return -1;
      }
      ptVar2 = (time_t *)(p + (long)output_local);
    }
    output_local = ptVar2;
    len._4_4_ = len._4_4_ + 1;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      size_t len = 0;
      const char *p = date;
      while(ISALPHA(*p) && (len < NAME_LEN)) {
        p++;
        len++;
      }

      if(len != NAME_LEN) {
        if(wdaynum == -1) {
          wdaynum = checkday(date, len);
          if(wdaynum != -1)
            found = TRUE;
        }
        if(!found && (monnum == -1)) {
          monnum = checkmonth(date, len);
          if(monnum != -1)
            found = TRUE;
        }

        if(!found && (tzoff == -1)) {
          /* this just must be a time zone string */
          tzoff = checktz(date, len);
          if(tzoff != -1)
            found = TRUE;
        }
      }
      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      if((secnum == -1) &&
         match_time(date, &hournum, &minnum, &secnum, &end)) {
        /* time stamp */
        date = end;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}